

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O0

bool ReadDebugInfo(char *fileName,DebugInfo *to)

{
  bool bVar1;
  ErrorCode EVar2;
  StreamHeader *pSVar3;
  undefined1 local_108 [8];
  DBIStream dbiStream;
  InfoStream infoStream;
  RawFile rawPdbFile;
  ErrorCode errorCode;
  MemoryMappedFile pdbFile;
  DebugInfo *to_local;
  char *fileName_local;
  
  pdbFile.fileSize = (size_t)to;
  MemoryMappedFile::MemoryMappedFile((MemoryMappedFile *)&errorCode,fileName);
  if (pdbFile._0_8_ == 0) {
    fprintf(_stderr,"  failed to memory-map PDB file \'%s\'\n",fileName);
    fileName_local._7_1_ = false;
  }
  else {
    EVar2 = PDB::ValidateFile((void *)pdbFile._0_8_);
    if (EVar2 == Success) {
      PDB::CreateRawFile((RawFile *)&infoStream.m_namesStreamIndex,(void *)pdbFile._0_8_);
      EVar2 = PDB::HasValidDBIStream((RawFile *)&infoStream.m_namesStreamIndex);
      if (EVar2 == Success) {
        PDB::InfoStream::InfoStream
                  ((InfoStream *)&dbiStream.m_stream.m_blockSizeLog2,
                   (RawFile *)&infoStream.m_namesStreamIndex);
        bVar1 = PDB::InfoStream::UsesDebugFastLink
                          ((InfoStream *)&dbiStream.m_stream.m_blockSizeLog2);
        if (bVar1) {
          fprintf(_stderr,"  PDB file \'%s\' uses unsupported option /DEBUG:FASTLINK\n",fileName);
          fileName_local._7_1_ = false;
        }
        else {
          PDB::CreateDBIStream((DBIStream *)local_108,(RawFile *)&infoStream.m_namesStreamIndex);
          bVar1 = HasValidDBIStreams((RawFile *)&infoStream.m_namesStreamIndex,
                                     (DBIStream *)local_108);
          if (bVar1) {
            pSVar3 = PDB::DBIStream::GetHeader((DBIStream *)local_108);
            if ((pSVar3->flags & 1) != 0) {
              printf(
                    "Warning: PDB file is created with incremental linking, some information might be misleading.\n"
                    );
            }
            pSVar3 = PDB::DBIStream::GetHeader((DBIStream *)local_108);
            if ((pSVar3->flags & 2) != 0) {
              printf(
                    "Warning: PDB file is stripped, some information might be missing or misleading.\n"
                    );
            }
            ReadEverything((RawFile *)&infoStream.m_namesStreamIndex,(DBIStream *)local_108,
                           (DebugInfo *)pdbFile.fileSize);
            fileName_local._7_1_ = true;
          }
          else {
            fprintf(_stderr,"  PDB file \'%s\' does not have required DBI sections\n",fileName);
            fileName_local._7_1_ = false;
          }
        }
        PDB::InfoStream::~InfoStream((InfoStream *)&dbiStream.m_stream.m_blockSizeLog2);
      }
      else {
        fprintf(_stderr,"  PDB file \'%s\' does not have valid DBI stream, error code %i\n",fileName
                ,(ulong)EVar2);
        fileName_local._7_1_ = false;
      }
      PDB::RawFile::~RawFile((RawFile *)&infoStream.m_namesStreamIndex);
    }
    else {
      fprintf(_stderr,"  failed to validate PDB file \'%s\': error code %i\n",fileName,(ulong)EVar2)
      ;
      fileName_local._7_1_ = false;
    }
  }
  MemoryMappedFile::~MemoryMappedFile((MemoryMappedFile *)&errorCode);
  return fileName_local._7_1_;
}

Assistant:

bool ReadDebugInfo(const char *fileName, DebugInfo &to)
{
    // open the PDB file
    MemoryMappedFile pdbFile(fileName);
    if (pdbFile.baseAddress == nullptr)
    {
        fprintf(stderr, "  failed to memory-map PDB file '%s'\n", fileName);
        return false;
    }
    PDB::ErrorCode errorCode = PDB::ValidateFile(pdbFile.baseAddress);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  failed to validate PDB file '%s': error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::RawFile rawPdbFile = PDB::CreateRawFile(pdbFile.baseAddress);
    errorCode = PDB::HasValidDBIStream(rawPdbFile);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  PDB file '%s' does not have valid DBI stream, error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::InfoStream infoStream(rawPdbFile);
    if (infoStream.UsesDebugFastLink())
    {
        fprintf(stderr, "  PDB file '%s' uses unsupported option /DEBUG:FASTLINK\n", fileName);
        return false;
    }
    const PDB::DBIStream dbiStream = PDB::CreateDBIStream(rawPdbFile);
    if (!HasValidDBIStreams(rawPdbFile, dbiStream))
    {
        fprintf(stderr, "  PDB file '%s' does not have required DBI sections\n", fileName);
        return false;
    }

    if (dbiStream.GetHeader().flags & 0x1)
    {
        printf("Warning: PDB file is created with incremental linking, some information might be misleading.\n");
    }
    if (dbiStream.GetHeader().flags & 0x2)
    {
        printf("Warning: PDB file is stripped, some information might be missing or misleading.\n");
    }

    ReadEverything(rawPdbFile, dbiStream, to);

    return true;
}